

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall
QTableModel::moveRows
          (QTableModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < sourceRow) {
    iVar4 = (**(code **)(*(long *)this + 0x78))();
    bVar2 = false;
    if ((destinationChild < 0) || (bVar2 = false, iVar4 < count + sourceRow)) goto LAB_0059d141;
    iVar4 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
    bVar2 = false;
    if ((sourceRow == destinationChild) || (iVar4 < destinationChild)) goto LAB_0059d141;
    if (((0 < count && destinationChild + -1 != sourceRow) &&
        (((sourceParent->r < 0 || (sourceParent->c < 0)) ||
         ((sourceParent->m).ptr == (QAbstractItemModel *)0x0)))) &&
       ((((destinationParent->r < 0 || (destinationParent->c < 0)) ||
         ((destinationParent->m).ptr == (QAbstractItemModel *)0x0)) &&
        (cVar3 = QAbstractItemModel::beginMoveRows
                           ((QModelIndex *)this,(int)sourceParent,sourceRow,
                            (QModelIndex *)(ulong)((count + sourceRow) - 1),(int)destinationParent),
        cVar3 != '\0')))) {
      iVar4 = (**(code **)(*(long *)this + 0x80))(this);
      iVar4 = iVar4 * count;
      if (iVar4 != 0) {
        iVar5 = (int)(this->horizontalHeaderItems).d.size;
        iVar6 = 0;
        if (destinationChild < sourceRow) {
          iVar6 = iVar4 + -1;
        }
        do {
          QList<QTableWidgetItem_*>::move
                    (&this->tableItems,(long)(iVar5 * sourceRow + iVar6),
                     (long)(int)(iVar5 * destinationChild - (uint)(sourceRow <= destinationChild)));
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      if (count != 0) {
        iVar6 = destinationChild + -1;
        iVar4 = 0;
        if (destinationChild < sourceRow) {
          iVar6 = destinationChild;
          iVar4 = count + -1;
        }
        do {
          QList<QTableWidgetItem_*>::move
                    (&this->verticalHeaderItems,(ulong)(uint)(iVar4 + sourceRow),(long)iVar6);
          count = count + -1;
        } while (count != 0);
      }
      QAbstractItemModel::endMoveRows();
      bVar2 = true;
      goto LAB_0059d141;
    }
  }
  bVar2 = false;
LAB_0059d141:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QTableModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(sourceParent, sourceRow, sourceRow + count - 1, destinationParent, destinationChild))
        return false;

    // Table items
    int numItems = count * columnCount();
    int fromIndex = tableIndex(sourceRow, 0);
    int destinationIndex = tableIndex(destinationChild, 0);
    if (destinationChild < sourceRow)
        fromIndex += numItems - 1;
    else
        destinationIndex--;
    while (numItems--)
        tableItems.move(fromIndex, destinationIndex);

    // Header items
    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        verticalHeaderItems.move(fromRow, destinationChild);

    endMoveRows();
    return true;
}